

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c
# Opt level: O1

int main(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  
  iVar1 = test_abi_C();
  iVar2 = test_int_C();
  iVar3 = test_include_C();
  iVar4 = test_abi_CXX();
  iVar5 = test_int_CXX();
  iVar6 = test_include_CXX();
  return (int)((iVar2 == 0 || iVar1 == 0) ||
              ((iVar4 == 0 || iVar3 == 0) || (iVar6 == 0 || iVar5 == 0)));
}

Assistant:

int main(void)
{
  int result = 1;
#ifdef KWIML_LANGUAGE_C
  result = test_abi_C() && result;
  result = test_int_C() && result;
  result = test_include_C() && result;
#endif
#ifdef KWIML_LANGUAGE_CXX
  result = test_abi_CXX() && result;
  result = test_int_CXX() && result;
  result = test_include_CXX() && result;
#endif
  return result? 0 : 1;
}